

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_cstep(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_power_cstep_entry2 *peVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  
  uVar12 = (bios->power).cstep.offset;
  iVar5 = -0x16;
  if ((ulong)uVar12 != 0) {
    if (uVar12 < bios->length) {
      uVar1 = bios->data[uVar12];
      (bios->power).cstep.version = uVar1;
    }
    else {
      (bios->power).cstep.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar1 = (bios->power).cstep.version;
    }
    if (uVar1 == '\x10') {
      uVar8 = (bios->power).cstep.offset;
      uVar12 = uVar8 + 1;
      uVar7 = bios->length;
      if (uVar12 < uVar7) {
        (bios->power).cstep.hlen = bios->data[uVar12];
        iVar5 = 0;
      }
      else {
        (bios->power).cstep.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
        uVar8 = (bios->power).cstep.offset;
        uVar7 = bios->length;
        iVar5 = -0xe;
      }
      uVar12 = uVar8 + 2;
      if (uVar12 < uVar7) {
        (bios->power).cstep.rlen = bios->data[uVar12];
        iVar9 = 0;
      }
      else {
        (bios->power).cstep.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
        uVar8 = (bios->power).cstep.offset;
        uVar7 = bios->length;
        iVar9 = -0xe;
      }
      uVar12 = uVar8 + 3;
      if (uVar12 < uVar7) {
        (bios->power).cstep.entriesnum = bios->data[uVar12];
        iVar2 = 0;
      }
      else {
        (bios->power).cstep.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
        uVar8 = (bios->power).cstep.offset;
        uVar7 = bios->length;
        iVar2 = -0xe;
      }
      uVar12 = uVar8 + 4;
      if (uVar12 < uVar7) {
        (bios->power).cstep.ssz = bios->data[uVar12];
        iVar3 = 0;
      }
      else {
        (bios->power).cstep.ssz = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
        uVar8 = (bios->power).cstep.offset;
        uVar7 = bios->length;
        iVar3 = -0xe;
      }
      if (uVar8 + 5 < uVar7) {
        (bios->power).cstep.snr = bios->data[uVar8 + 5];
        iVar4 = 0;
      }
      else {
        (bios->power).cstep.snr = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      (bios->power).cstep.valid =
           (((iVar9 == 0 && iVar5 == 0) && iVar2 == 0) && iVar3 == 0) && iVar4 == 0;
      bVar14 = (bios->power).cstep.entriesnum;
      if (8 < bVar14) {
        __assert_fail("cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nvbios/power.c"
                      ,0x245,"int envy_bios_parse_power_cstep(struct envy_bios *)");
      }
      if (bVar14 != 0) {
        uVar13 = 0;
        do {
          iVar5 = (uint)(bios->power).cstep.hlen + (bios->power).cstep.offset;
          iVar9 = (uint)(bios->power).cstep.rlen * (int)uVar13;
          uVar7 = iVar9 + iVar5 + 1;
          uVar10 = iVar5 + iVar9;
          uVar12 = bios->length;
          if (uVar7 < uVar12) {
            bVar14 = (byte)(CONCAT11(bios->data[uVar7],bios->data[uVar10]) >> 5) & 0xf;
          }
          else {
            bVar14 = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar10);
            uVar12 = bios->length;
          }
          (bios->power).cstep.ent1[uVar13].offset = uVar10;
          (bios->power).cstep.ent1[uVar13].pstate = bVar14;
          uVar10 = uVar10 + 3;
          if (uVar10 < uVar12) {
            (bios->power).cstep.ent1[uVar13].index = bios->data[uVar10];
          }
          else {
            (bios->power).cstep.ent1[uVar13].index = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar10);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (bios->power).cstep.entriesnum);
      }
      bVar14 = (bios->power).cstep.snr;
      peVar6 = (envy_bios_power_cstep_entry2 *)calloc(1,(ulong)((uint)bVar14 * 4) * 3);
      (bios->power).cstep.ent2 = peVar6;
      if (bVar14 != 0) {
        lVar11 = 0;
        uVar13 = 0;
        do {
          iVar9 = (uint)(bios->power).cstep.rlen * (uint)(bios->power).cstep.entriesnum +
                  (uint)(bios->power).cstep.hlen + (bios->power).cstep.offset;
          iVar5 = (uint)(bios->power).cstep.ssz * (int)uVar13;
          uVar12 = iVar9 + iVar5;
          *(uint *)(peVar6->unkn + lVar11 + -8) = uVar12;
          uVar10 = iVar5 + iVar9 + 1;
          uVar7 = bios->length;
          if (uVar10 < uVar7) {
            *(ushort *)(peVar6->unkn + lVar11 + -2) =
                 CONCAT11(bios->data[uVar10],bios->data[uVar12]);
          }
          else {
            (peVar6->unkn + lVar11 + -2)[0] = '\0';
            (peVar6->unkn + lVar11 + -2)[1] = '\0';
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar12);
            peVar6 = (bios->power).cstep.ent2;
            uVar7 = bios->length;
          }
          if (uVar12 + 2 < uVar7) {
            peVar6->unkn[lVar11] = bios->data[uVar12 + 2];
          }
          else {
            peVar6->unkn[lVar11] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          peVar6 = (bios->power).cstep.ent2;
          if (uVar12 + 3 < bios->length) {
            peVar6->unkn[lVar11 + 1] = bios->data[uVar12 + 3];
          }
          else {
            peVar6->unkn[lVar11 + 1] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          uVar12 = uVar12 + 4;
          peVar6 = (bios->power).cstep.ent2;
          if (uVar12 < bios->length) {
            peVar6->unkn[lVar11 + 2] = bios->data[uVar12];
          }
          else {
            peVar6->unkn[lVar11 + 2] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
          }
          peVar6 = (bios->power).cstep.ent2;
          peVar6->unkn[lVar11 + -4] = *(short *)(peVar6->unkn + lVar11 + -2) != 0;
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0xc;
        } while (uVar13 < (bios->power).cstep.snr);
      }
      iVar5 = 0;
    }
    else {
      envy_bios_parse_power_cstep_cold_1();
    }
  }
  return iVar5;
}

Assistant:

int envy_bios_parse_power_cstep(struct envy_bios *bios) {
	struct envy_bios_power_cstep *cstep = &bios->power.cstep;
	int i, err = 0;

	if (!cstep->offset)
		return -EINVAL;

	bios_u8(bios, cstep->offset + 0x0, &cstep->version);
	switch(cstep->version) {
	case 0x10:
		err |= bios_u8(bios, cstep->offset + 0x1, &cstep->hlen);
		err |= bios_u8(bios, cstep->offset + 0x2, &cstep->rlen);
		err |= bios_u8(bios, cstep->offset + 0x3, &cstep->entriesnum);
		err |= bios_u8(bios, cstep->offset + 0x4, &cstep->ssz);
		err |= bios_u8(bios, cstep->offset + 0x5, &cstep->snr);
		cstep->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown CSTEP table version 0x%x\n", cstep->version);
		return -EINVAL;
	};

	assert(cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1)));
	for (i = 0; i < cstep->entriesnum; i++) {
		uint32_t data = cstep->offset + cstep->hlen + i * cstep->rlen;

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);

		cstep->ent1[i].offset = data;
		cstep->ent1[i].pstate = (tmp & 0x01e0) >> 5;
		bios_u8(bios, data + 0x3, &cstep->ent1[i].index);
	}

	cstep->ent2 = malloc(cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	memset(cstep->ent2, 0x0, cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	for (i = 0; i < cstep->snr; i++) {
		uint32_t data = cstep->offset + cstep->hlen + (cstep->entriesnum * cstep->rlen) + (i * cstep->ssz);

		cstep->ent2[i].offset = data;
		bios_u16(bios, data + 0x0, &cstep->ent2[i].freq);
		bios_u8(bios, data + 0x2, &cstep->ent2[i].unkn[0]);
		bios_u8(bios, data + 0x3, &cstep->ent2[i].unkn[1]);
		bios_u8(bios, data + 0x4, &cstep->ent2[i].voltage);
		cstep->ent2[i].valid = (cstep->ent2[i].freq > 0);
	}

	return 0;
}